

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilDouble.h
# Opt level: O0

xdbl Xdbl_Mul(xdbl a,xdbl b)

{
  word wVar1;
  word wVar2;
  word MntBl;
  word MntAl;
  word MntBh;
  word MntAh;
  word MntB;
  word MntA;
  word Mnt;
  word Exp;
  xdbl b_local;
  xdbl a_local;
  
  Exp = b;
  b_local = a;
  if (a < b) {
    Exp = a;
    b_local = b;
  }
  if (Exp <= b_local) {
    wVar1 = Xdbl_Mnt(b_local);
    wVar2 = Xdbl_Mnt(Exp);
    MntA = (wVar1 >> 0x20) * (wVar2 >> 0x20) * 0x20000 +
           ((wVar1 & 0xffffffff) * (wVar2 & 0xffffffff) >> 0x2f) +
           ((wVar1 & 0xffffffff) * (wVar2 >> 0x20) >> 0xf) +
           ((wVar1 >> 0x20) * (wVar2 & 0xffffffff) >> 0xf);
    wVar1 = Xdbl_Exp(b_local);
    wVar2 = Xdbl_Exp(Exp);
    Mnt = wVar1 + wVar2;
    if (MntA >> 0x30 != 0) {
      Mnt = Mnt + 1;
      MntA = MntA >> 1;
    }
    if (Mnt >> 0x10 == 0) {
      a_local = Xdbl_Create(Mnt,MntA);
    }
    else {
      a_local = Xdbl_Maximum();
    }
    return a_local;
  }
  __assert_fail("a >= b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                ,0x6f,"xdbl Xdbl_Mul(xdbl, xdbl)");
}

Assistant:

static inline xdbl Xdbl_Mul( xdbl a, xdbl b )
{
    word Exp, Mnt, MntA, MntB, MntAh, MntBh, MntAl, MntBl;
    if ( a < b ) a ^= b, b ^= a, a ^= b;
    assert( a >= b );
    MntA  = Xdbl_Mnt(a);
    MntB  = Xdbl_Mnt(b);
    MntAh = MntA>>32;
    MntBh = MntB>>32;
    MntAl = (MntA<<32)>>32;
    MntBl = (MntB<<32)>>32;
    Mnt = ((MntAh * MntBh) << 17) + ((MntAl * MntBl) >> 47) + ((MntAl * MntBh) >> 15) + ((MntAh * MntBl) >> 15);
    Exp = Xdbl_Exp(a) + Xdbl_Exp(b);
    if ( Mnt >> 48 ) // new MSB is created
        Exp++, Mnt >>= 1;
    if ( Exp >> 16 ) // overflow
        return Xdbl_Maximum();
    return Xdbl_Create( Exp, Mnt );
}